

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFullTypeName(ParserImpl *this,string *name)

{
  bool bVar1;
  string part;
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar1 = ConsumeIdentifier(this,name);
  if (bVar1) {
    while( true ) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,".",(allocator<char> *)&local_60);
      bVar1 = TryConsume(this,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (!bVar1) break;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      bVar1 = ConsumeIdentifier(this,&local_b0);
      if (!bVar1) {
        std::__cxx11::string::~string((string *)&local_b0);
        goto LAB_0026f26d;
      }
      local_90.piece_ = absl::lts_20250127::NullSafeStringView(".");
      local_60.piece_._M_len = local_b0._M_string_length;
      local_60.piece_._M_str = local_b0._M_dataplus._M_p;
      absl::lts_20250127::StrAppend(name,&local_90,&local_60);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    bVar1 = true;
  }
  else {
LAB_0026f26d:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ConsumeFullTypeName(std::string* name) {
    DO(ConsumeIdentifier(name));
    while (TryConsume(".")) {
      std::string part;
      DO(ConsumeIdentifier(&part));
      absl::StrAppend(name, ".", part);
    }
    return true;
  }